

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_sophia.cpp
# Opt level: O2

int main(void)

{
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  int eventID;
  int iVar5;
  undefined1 auStack_8cc48 [8];
  sophia_interface SI;
  sophiaevent_output seo;
  ofstream outfile;
  
  *(undefined8 *)(std::ofstream::close + *(long *)(std::cout + -0x18)) = 10;
  std::ofstream::ofstream(&seo.Nout);
  std::ofstream::open((char *)&seo.Nout,0x102018);
  poVar3 = std::operator<<((ostream *)&seo.Nout,"eventID\t");
  poVar3 = std::operator<<(poVar3,"partID\t");
  std::operator<<(poVar3,"EGeV\n");
  iVar5 = 0;
  while (iVar5 != 10000) {
    sophia_interface::sophiaevent((bool)((char)&SI + 'H'),1000000000.0,1e-09,SUB81(auStack_8cc48,0))
    ;
    iVar5 = iVar5 + 1;
    uVar1 = seo.outPartID[0x7ce];
    if (seo.outPartID[0x7ce] < 1) {
      uVar1 = 0;
    }
    for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&seo.Nout,iVar5);
      poVar3 = std::operator<<(poVar3,"\t");
      iVar2 = ID_sophia_to_PDG(seo.outPartID[uVar4 - 2]);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>(seo.outPartP[2][uVar4 + 1999]);
      std::operator<<(poVar3,"\n");
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&seo.Nout);
  return 0;
}

Assistant:

int main() {
    std::cout.precision(10);

    bool onProton = true;
    // bool onProton = false;
    double Ein = 1e9;  // GeV
    double eps = 1e-9;  // GeV
    bool declareChargedPionsStable = true;
    // bool declareChargedPionsStable = false;

    std::ofstream outfile;
    outfile.open("outData.csv");

    outfile << "eventID\t" << "partID\t" << "EGeV\n";

    int nEvent = 10000;
    for (int k = 0; k < nEvent; ++k) {

        sophia_interface SI;

        // std::cout << "Event # " << k + 1 << std::endl;

        sophiaevent_output seo = SI.sophiaevent(onProton, Ein, eps, declareChargedPionsStable);


        // std::cout << "\nevent result # " << (k + 1) << std::endl;
        int Nout = seo.Nout;
        // std::cout << "N = " <<Nout << std::endl;
        for (int i = 0; i < Nout; ++i) {
        //     std::cout << "ID = " << ID_sophia_to_PDG(seo.outPartID[i]) << std::endl;
            for (int j = 0; j < 5; ++j) {
                // if (j == 3) std::cout << seo.outPartP[j][i] << std::endl;
                if (j == 3) {
                    int eventID = k + 1;
                    outfile << eventID << "\t"
                            << ID_sophia_to_PDG(seo.outPartID[i]) << "\t"
                            << seo.outPartP[j][i] << "\n";
                }
            }
        }
        // std::cout << "\n---------------------------------" << std::endl;
    }
    outfile.close();
}